

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvapoke.c
# Opt level: O2

int main(int argc,char **argv)

{
  uint32_t uVar1;
  char cVar2;
  int iVar3;
  nva_regspace_type nVar4;
  nva_err err;
  int *piVar5;
  char *pcVar6;
  size_t sStack_70;
  uint32_t b;
  uint32_t a;
  nva_regspace rs;
  uint64_t step;
  uint64_t val;
  
  iVar3 = nva_init();
  if (iVar3 == 0) {
    rs.regsz = 0;
    rs.idx = 0;
    rs.card = (nva_card *)0x0;
    rs.cnum = 0;
    rs.type = NVA_REGSPACE_BAR0;
    do {
      while (iVar3 = getopt(argc,argv,"c:i:b:t:"), iVar3 != 0x62) {
        piVar5 = &rs.cnum;
        if ((iVar3 == 99) || (piVar5 = &rs.idx, iVar3 == 0x69)) {
          __isoc99_sscanf(_optarg,"%d",piVar5);
        }
        else if (iVar3 == 0x74) {
          nVar4 = nva_rstype(_optarg);
          rs.type = nVar4;
          if (nVar4 == NVA_REGSPACE_UNKNOWN) {
            pcVar6 = "Unknown register space.\n";
            sStack_70 = 0x18;
            goto LAB_00102672;
          }
        }
        else if (iVar3 == -1) {
          if (rs.cnum < nva_cardsnum) {
            rs.card = nva_cards[rs.cnum];
            if (rs.regsz == 0) {
              iVar3 = nva_rsdefsz(&rs);
              rs.regsz = iVar3;
            }
            iVar3 = nva_rsunitsz(&rs);
            b = rs.regsz / iVar3;
            step = 0;
            if (_optind < argc) {
              __isoc99_sscanf(argv[_optind],"%x",&a);
              if (_optind + 1 < argc) {
                pcVar6 = argv[(long)_optind + 1];
                if (_optind + 2 < argc) {
                  __isoc99_sscanf(pcVar6,"%x",&b);
                  pcVar6 = argv[(long)_optind + 2];
                }
                __isoc99_sscanf(pcVar6,"%lx",&val);
                if (_optind + 3 < argc) {
                  __isoc99_sscanf(argv[(long)_optind + 3],"%lx",&step);
                }
                for (; b != 0; b = b - rs.regsz / iVar3) {
                  err = nva_wr(&rs,a,val);
                  uVar1 = a;
                  if (err != NVA_ERR_SUCCESS) {
                    cVar2 = nva_rserrc(err);
                    printf("%08x: ERR %c\n",(ulong)uVar1,(ulong)(uint)(int)cVar2);
                  }
                  a = a + rs.regsz / iVar3;
                  val = val + step;
                }
                return 0;
              }
              pcVar6 = "No value specified.\n";
              sStack_70 = 0x14;
            }
            else {
              pcVar6 = "No address specified.\n";
              sStack_70 = 0x16;
            }
          }
          else {
            if (nva_cardsnum != 0) {
              pcVar6 = "No such card.\n";
              goto LAB_00102670;
            }
            pcVar6 = "No cards found.\n";
            sStack_70 = 0x10;
          }
          goto LAB_00102672;
        }
      }
      __isoc99_sscanf(_optarg,"%d",&rs.regsz);
    } while (((uint)rs.regsz < 9) && ((0x116U >> (rs.regsz & 0x1fU) & 1) != 0));
    pcVar6 = "Invalid size.\n";
LAB_00102670:
    sStack_70 = 0xe;
  }
  else {
    pcVar6 = "PCI init failure!\n";
    sStack_70 = 0x12;
  }
LAB_00102672:
  fwrite(pcVar6,sStack_70,1,_stderr);
  return 1;
}

Assistant:

int main(int argc, char **argv) {
	if (nva_init()) {
		fprintf (stderr, "PCI init failure!\n");
		return 1;
	}
	int c;
	struct nva_regspace rs = { 0 };
	while ((c = getopt (argc, argv, "c:i:b:t:")) != -1)
		switch (c) {
			case 'c':
				sscanf(optarg, "%d", &rs.cnum);
				break;
			case 'i':
				sscanf(optarg, "%d", &rs.idx);
				break;
			case 'b':
				sscanf(optarg, "%d", &rs.regsz);
				if (rs.regsz != 1 && rs.regsz != 2 && rs.regsz != 4 && rs.regsz != 8) {
					fprintf (stderr, "Invalid size.\n");
					return 1;
				}
				break;
			case 't':
				rs.type = nva_rstype(optarg);
				if (rs.type == NVA_REGSPACE_UNKNOWN) {
					fprintf (stderr, "Unknown register space.\n");
					return 1;
				}
				break;
		}
	if (rs.cnum >= nva_cardsnum) {
		if (nva_cardsnum)
			fprintf (stderr, "No such card.\n");
		else
			fprintf (stderr, "No cards found.\n");
		return 1;
	}
	rs.card = nva_cards[rs.cnum];
	if (rs.regsz == 0)
		rs.regsz = nva_rsdefsz(&rs);
	int unit = nva_rsunitsz(&rs);
	uint32_t a, b = rs.regsz/unit;
	uint64_t val, step = 0;
	if (optind >= argc) {
		fprintf (stderr, "No address specified.\n");
		return 1;
	}
	sscanf (argv[optind], "%x", &a);
	if (optind + 1 >= argc) {
		fprintf (stderr, "No value specified.\n");
		return 1;
	}
	if (optind + 2 >= argc) {
		sscanf (argv[optind + 1], "%"SCNx64, &val);
	} else {
		sscanf (argv[optind + 1], "%x", &b);
		sscanf (argv[optind + 2], "%"SCNx64, &val);
	}
	if (optind + 3 < argc)
		sscanf (argv[optind + 3], "%"SCNx64, &step);
	while (b > 0) {
		int e = nva_wr(&rs, a, val);
		if (e)
			printf("%08x: ERR %c\n", a, nva_rserrc(e));
		a += rs.regsz/unit;
		b -= rs.regsz/unit;
		val += step;
	}
	return 0;
}